

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtree.c
# Opt level: O0

void remove_recolour(opr_rbtree *head,opr_rbtree_node *parent,opr_rbtree_node *node)

{
  opr_rbtree_node *poVar1;
  bool bVar2;
  opr_rbtree_node *local_28;
  opr_rbtree_node *other;
  opr_rbtree_node *node_local;
  opr_rbtree_node *parent_local;
  opr_rbtree *head_local;
  
  other = node;
  node_local = parent;
  do {
    poVar1 = node_local;
    if ((other == (opr_rbtree_node *)0x0) || (bVar2 = false, other->red == 0)) {
      bVar2 = other != head->root;
    }
    if (!bVar2) goto LAB_001152ee;
    if (node_local->left == other) {
      local_28 = node_local->right;
      if (local_28->red != 0) {
        local_28->red = 0;
        node_local->red = 1;
        rotateleft(head,node_local);
        local_28 = node_local->right;
      }
      if (((local_28->left != (opr_rbtree_node *)0x0) && (local_28->left->red != 0)) ||
         ((local_28->right != (opr_rbtree_node *)0x0 && (local_28->right->red != 0)))) {
        if ((local_28->right == (opr_rbtree_node *)0x0) || (local_28->right->red == 0)) {
          local_28->left->red = 0;
          local_28->red = 1;
          rotateright(head,local_28);
          local_28 = node_local->right;
        }
        local_28->red = node_local->red;
        node_local->red = 0;
        local_28->right->red = 0;
        rotateleft(head,node_local);
        other = head->root;
LAB_001152ee:
        if (other != (opr_rbtree_node *)0x0) {
          other->red = 0;
        }
        return;
      }
      local_28->red = 1;
      node_local = node_local->parent;
    }
    else {
      local_28 = node_local->left;
      if (local_28->red != 0) {
        local_28->red = 0;
        node_local->red = 1;
        rotateright(head,node_local);
        local_28 = node_local->left;
      }
      if (((local_28->left != (opr_rbtree_node *)0x0) && (local_28->left->red != 0)) ||
         ((local_28->right != (opr_rbtree_node *)0x0 && (local_28->right->red != 0)))) {
        if ((local_28->left == (opr_rbtree_node *)0x0) || (local_28->left->red == 0)) {
          local_28->right->red = 0;
          local_28->red = 1;
          rotateleft(head,local_28);
          local_28 = node_local->left;
        }
        local_28->red = node_local->red;
        node_local->red = 0;
        local_28->left->red = 0;
        rotateright(head,node_local);
        other = head->root;
        goto LAB_001152ee;
      }
      local_28->red = 1;
      node_local = node_local->parent;
    }
    other = poVar1;
  } while( true );
}

Assistant:

static void remove_recolour(struct opr_rbtree *head,
			    struct opr_rbtree_node *parent,
			    struct opr_rbtree_node *node)
{
	struct opr_rbtree_node *other;

	while ((node == NULL || !node->red) && node != head->root) {
		if (parent->left == node) {
			other = parent->right;
			if (other->red) {
				other->red = 0;
				parent->red = 1;
				rotateleft(head, parent);
				other = parent->right;
			}
			if ((other->left == NULL || !other->left->red)
			    && (other->right == NULL || !other->right->red)) {
				other->red = 1;
				node = parent;
				parent = node->parent;
			} else {
				if ((other->right == NULL) ||
				    (!other->right->red)) {
					other->left->red = 0;
					other->red = 1;
					rotateright(head, other);
					other = parent->right;
				}
				other->red = parent->red;
				parent->red = 0;
				other->right->red = 0;
				rotateleft(head, parent);
				node = head->root;
				break;
			}
		} else {
			other = parent->left;
			if (other->red) {
				other->red = 0;
				parent->red = 1;
				rotateright(head, parent);
				other = parent->left;
			}
			if ((other->left == NULL || !other->left->red)
			    && (other->right == NULL || !other->right->red)) {
				other->red = 1;
				node = parent;
				parent = node->parent;
			} else {
				if (other->left == NULL || !other->left->red) {
					other->right->red = 0;
					other->red = 1;
					rotateleft(head, other);
					other = parent->left;
				}
				other->red = parent->red;
				parent->red = 0;
				other->left->red = 0;
				rotateright(head, parent);
				node = head->root;
				break;
			}
		}
	}
	if (node)
		node->red = 0;
}